

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

void finish_pass(j_compress_ptr cinfo)

{
  j_compress_ptr cinfo_00;
  long lVar1;
  long in_RDI;
  INT32 temp;
  arith_entropy_ptr e;
  int iVar3;
  long lVar2;
  
  lVar2 = *(long *)(in_RDI + 0x230);
  cinfo_00 = (j_compress_ptr)(*(long *)(lVar2 + 0x20) + -1 + *(long *)(lVar2 + 0x18) & 0xffff0000);
  if ((long)cinfo_00 < *(long *)(lVar2 + 0x18)) {
    *(double **)(lVar2 + 0x18) = &cinfo_00[0x38].input_gamma;
  }
  else {
    *(j_compress_ptr *)(lVar2 + 0x18) = cinfo_00;
  }
  *(long *)(lVar2 + 0x18) = *(long *)(lVar2 + 0x18) << ((byte)*(undefined4 *)(lVar2 + 0x38) & 0x3f);
  if ((*(ulong *)(lVar2 + 0x18) & 0xf8000000) == 0) {
    if (*(int *)(lVar2 + 0x3c) == 0) {
      *(long *)(lVar2 + 0x30) = *(long *)(lVar2 + 0x30) + 1;
    }
    else if (-1 < *(int *)(lVar2 + 0x3c)) {
      lVar1 = *(long *)(lVar2 + 0x30);
      while (iVar3 = (int)((ulong)lVar2 >> 0x20), lVar1 != 0) {
        emit_byte(iVar3,cinfo_00);
        lVar1 = *(long *)(lVar2 + 0x30) + -1;
        *(long *)(lVar2 + 0x30) = lVar1;
      }
      emit_byte(iVar3,cinfo_00);
    }
    if (*(long *)(lVar2 + 0x28) != 0) {
      lVar1 = *(long *)(lVar2 + 0x30);
      while (lVar1 != 0) {
        emit_byte((int)((ulong)lVar2 >> 0x20),cinfo_00);
        lVar1 = *(long *)(lVar2 + 0x30) + -1;
        *(long *)(lVar2 + 0x30) = lVar1;
      }
      do {
        emit_byte((int)((ulong)lVar2 >> 0x20),cinfo_00);
        emit_byte((int)((ulong)lVar2 >> 0x20),cinfo_00);
        lVar1 = *(long *)(lVar2 + 0x28) + -1;
        *(long *)(lVar2 + 0x28) = lVar1;
      } while (lVar1 != 0);
    }
  }
  else {
    if (-1 < *(int *)(lVar2 + 0x3c)) {
      lVar1 = *(long *)(lVar2 + 0x30);
      while (iVar3 = (int)((ulong)lVar2 >> 0x20), lVar1 != 0) {
        emit_byte(iVar3,cinfo_00);
        lVar1 = *(long *)(lVar2 + 0x30) + -1;
        *(long *)(lVar2 + 0x30) = lVar1;
      }
      emit_byte(iVar3,cinfo_00);
      if (*(int *)(lVar2 + 0x3c) == 0xfe) {
        emit_byte((int)((ulong)lVar2 >> 0x20),cinfo_00);
      }
    }
    *(long *)(lVar2 + 0x30) = *(long *)(lVar2 + 0x28) + *(long *)(lVar2 + 0x30);
    *(undefined8 *)(lVar2 + 0x28) = 0;
  }
  if ((*(ulong *)(lVar2 + 0x18) & 0x7fff800) != 0) {
    lVar1 = *(long *)(lVar2 + 0x30);
    while (iVar3 = (int)((ulong)lVar2 >> 0x20), lVar1 != 0) {
      emit_byte(iVar3,cinfo_00);
      lVar1 = *(long *)(lVar2 + 0x30) + -1;
      *(long *)(lVar2 + 0x30) = lVar1;
    }
    emit_byte(iVar3,cinfo_00);
    if ((*(long *)(lVar2 + 0x18) >> 0x13 & 0xffU) == 0xff) {
      emit_byte((int)((ulong)lVar2 >> 0x20),cinfo_00);
    }
    if (((*(ulong *)(lVar2 + 0x18) & 0x7f800) != 0) &&
       (emit_byte((int)((ulong)lVar2 >> 0x20),cinfo_00),
       (*(long *)(lVar2 + 0x18) >> 0xb & 0xffU) == 0xff)) {
      emit_byte((int)((ulong)lVar2 >> 0x20),cinfo_00);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
finish_pass (j_compress_ptr cinfo)
{
  arith_entropy_ptr e = (arith_entropy_ptr) cinfo->entropy;
  INT32 temp;

  /* Section D.1.8: Termination of encoding */

  /* Find the e->c in the coding interval with the largest
   * number of trailing zero bits */
  if ((temp = (e->a - 1 + e->c) & 0xFFFF0000L) < e->c)
    e->c = temp + 0x8000L;
  else
    e->c = temp;
  /* Send remaining bytes to output */
  e->c <<= e->ct;
  if (e->c & 0xF8000000L) {
    /* One final overflow has to be handled */
    if (e->buffer >= 0) {
      if (e->zc)
	do emit_byte(0x00, cinfo);
	while (--e->zc);
      emit_byte(e->buffer + 1, cinfo);
      if (e->buffer + 1 == 0xFF)
	emit_byte(0x00, cinfo);
    }
    e->zc += e->sc;  /* carry-over converts stacked 0xFF bytes to 0x00 */
    e->sc = 0;
  } else {
    if (e->buffer == 0)
      ++e->zc;
    else if (e->buffer >= 0) {
      if (e->zc)
	do emit_byte(0x00, cinfo);
	while (--e->zc);
      emit_byte(e->buffer, cinfo);
    }
    if (e->sc) {
      if (e->zc)
	do emit_byte(0x00, cinfo);
	while (--e->zc);
      do {
	emit_byte(0xFF, cinfo);
	emit_byte(0x00, cinfo);
      } while (--e->sc);
    }
  }
  /* Output final bytes only if they are not 0x00 */
  if (e->c & 0x7FFF800L) {
    if (e->zc)  /* output final pending zero bytes */
      do emit_byte(0x00, cinfo);
      while (--e->zc);
    emit_byte((e->c >> 19) & 0xFF, cinfo);
    if (((e->c >> 19) & 0xFF) == 0xFF)
      emit_byte(0x00, cinfo);
    if (e->c & 0x7F800L) {
      emit_byte((e->c >> 11) & 0xFF, cinfo);
      if (((e->c >> 11) & 0xFF) == 0xFF)
	emit_byte(0x00, cinfo);
    }
  }
}